

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O2

void __thiscall
testing::StrictMock<solitaire::archivers::SnapshotMock>::StrictMock
          (StrictMock<solitaire::archivers::SnapshotMock> *this)

{
  Mock::FailUninterestingCalls(this);
  memset(this,0,0x98);
  solitaire::archivers::SnapshotMock::SnapshotMock(&this->super_SnapshotMock);
  (this->super_SnapshotMock).super_Snapshot._vptr_Snapshot = (_func_int **)&PTR__StrictMock_002ed640
  ;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }